

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O1

expr_t __thiscall DL::DataLisp::expression(DataLisp *this,string_t *name)

{
  DataLisp_Internal *pDVar1;
  const_iterator cVar2;
  mapped_type *pp_Var3;
  mapped_type p_Var4;
  
  pDVar1 = this->mInternal;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>_>
          ::find(&(pDVar1->mExpressions)._M_t,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(pDVar1->mExpressions)._M_t._M_impl.super__Rb_tree_header
     ) {
    p_Var4 = (mapped_type)0x0;
  }
  else {
    pp_Var3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>_>
              ::at(&this->mInternal->mExpressions,name);
    p_Var4 = *pp_Var3;
  }
  return (expr_t)p_Var4;
}

Assistant:

expr_t DataLisp::expression(const string_t& name)
{
	if (mInternal->mExpressions.count(name))
		return mInternal->mExpressions.at(name);
	else
		return nullptr;
}